

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SingleBindingCase::SingleBindingCase
          (SingleBindingCase *this,Context *ctx,char *name,int flags)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"draw test pattern",0x11);
  if ((flags & 1U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", attribute offset (unaligned)",0x1e);
  }
  if ((flags & 2U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", attribute offset (aligned)",0x1c);
  }
  if ((flags & 4U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", 2 attributes",0xe);
  }
  if ((flags & 8U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", 2 attributes (some components shared)",0x27);
  }
  if ((flags & 0x10U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", buffer offset aligned",0x17);
  }
  if ((flags & 0x20U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", buffer offset unaligned",0x19);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  tcu::TestCase::TestCase((TestCase *)this,ctx->m_testCtx,name,(char *)local_1c0);
  (this->super_BindingRenderCase).super_TestCase.m_context = ctx;
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BindingRenderCase_021b10f8;
  (this->super_BindingRenderCase).m_unalignedData =
       (bool)((flags & 0x22U) == 0x20 | (byte)flags & 1);
  (this->super_BindingRenderCase).m_vao = 0;
  (this->super_BindingRenderCase).m_program = (ShaderProgram *)0x0;
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  uVar3 = 0x20;
  if ((flags & 0x10U) == 0) {
    uVar3 = (flags << 0x1a) >> 0x1f & 0x13;
  }
  uVar5 = 4 - (uVar3 & 3);
  if ((uVar3 & 3) == 0) {
    uVar5 = 0;
  }
  uVar4 = 3;
  if ((flags & 1U) == 0) {
    uVar4 = uVar5 & (flags << 0x1e) >> 0x1f;
  }
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleBindingCase_021b1078;
  uVar5 = 8;
  if ((flags & 8U) == 0) {
    uVar5 = -(uint)((flags & 4U) == 0) | 0x10;
  }
  uVar1 = uVar5 + 0x10;
  if ((int)(uVar5 + 0x10) < (int)(uVar4 + 0x10)) {
    uVar1 = uVar4 + 0x10;
  }
  (this->m_spec).bufferOffset = uVar3;
  iVar2 = 4 - (uVar1 & 3);
  if ((uVar1 & 3) == 0) {
    iVar2 = 0;
  }
  (this->m_spec).bufferStride = iVar2 + uVar1;
  (this->m_spec).positionAttrOffset = uVar4;
  (this->m_spec).colorAttrOffset = uVar5;
  (this->m_spec).hasColorAttr = (flags & 0xcU) != 0;
  this->m_buf = 0;
  return;
}

Assistant:

SingleBindingCase::SingleBindingCase (Context& ctx, const char* name, int flags)
	: BindingRenderCase	(ctx, name, genTestDescription(flags).c_str(), isDataUnaligned(flags))
	, m_spec			(genTestSpec(flags))
	, m_buf				(0)
{
	DE_ASSERT(!((flags & FLAG_ATTRIB_UNALIGNED) && (flags & FLAG_ATTRIB_ALIGNED)));
	DE_ASSERT(!((flags & FLAG_ATTRIB_ALIGNED) && (flags & FLAG_BUF_UNALIGNED_STRIDE)));

	DE_ASSERT(!isDataUnaligned(flags));
}